

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O1

int Abc_SclCheckNtk(Abc_Ntk_t *p,int fVerbose)

{
  ulong uVar1;
  undefined4 uVar2;
  long *plVar3;
  long *plVar4;
  long lVar5;
  int *piVar6;
  Vec_Ptr_t *pVVar7;
  int iVar8;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  int iVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  int local_40;
  
  if ((p->vTravIds).pArray == (int *)0x0) {
    iVar8 = p->vObjs->nSize;
    uVar1 = (long)iVar8 + 500;
    iVar9 = (int)uVar1;
    if ((p->vTravIds).nCap < iVar9) {
      piVar6 = (int *)malloc(uVar1 * 4);
      (p->vTravIds).pArray = piVar6;
      if (piVar6 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p->vTravIds).nCap = iVar9;
      in_RDX = extraout_RDX;
    }
    if (-500 < iVar8) {
      memset((p->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
      in_RDX = extraout_RDX_00;
    }
    (p->vTravIds).nSize = iVar9;
  }
  iVar8 = p->nTravIds;
  p->nTravIds = iVar8 + 1;
  if (0x3ffffffe < iVar8) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pVVar7 = p->vCis;
  if (0 < pVVar7->nSize) {
    lVar10 = 0;
    do {
      lVar11 = *pVVar7->pArray[lVar10];
      uVar2 = *(undefined4 *)(lVar11 + 0xd8);
      iVar8 = (int)*(long *)((long)pVVar7->pArray[lVar10] + 0x10);
      Vec_IntFillExtra((Vec_Int_t *)(lVar11 + 0xe0),iVar8 + 1,(int)in_RDX);
      if (((long)iVar8 < 0) || (*(int *)(lVar11 + 0xe4) <= iVar8)) goto LAB_00428715;
      *(undefined4 *)(*(long *)(lVar11 + 0xe8) + (long)iVar8 * 4) = uVar2;
      lVar10 = lVar10 + 1;
      pVVar7 = p->vCis;
      in_RDX = extraout_RDX_01;
    } while (lVar10 < pVVar7->nSize);
  }
  pVVar7 = p->vObjs;
  if (pVVar7->nSize < 1) {
    local_40 = 1;
  }
  else {
    local_40 = 1;
    lVar10 = 0;
    do {
      iVar8 = (int)in_RDX;
      plVar3 = (long *)pVVar7->pArray[lVar10];
      if ((plVar3 != (long *)0x0) && ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 7)) {
        if (0 < *(int *)((long)plVar3 + 0x1c)) {
          lVar11 = 0;
          do {
            plVar4 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                               (long)*(int *)(plVar3[4] + lVar11 * 4) * 8);
            lVar5 = *plVar4;
            iVar8 = (int)plVar4[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar8 + 1,(int)in_RDX);
            if (((long)iVar8 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar8)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            in_RDX = extraout_RDX_02;
            if (*(int *)(*(long *)(lVar5 + 0xe8) + (long)iVar8 * 4) != *(int *)(*plVar4 + 0xd8)) {
              local_40 = 0;
              printf("obj %d and its fanin %d are not in the topo order\n",
                     (ulong)*(uint *)(plVar3 + 2),(ulong)*(uint *)(plVar4 + 2));
              in_RDX = extraout_RDX_03;
            }
            iVar8 = (int)in_RDX;
            lVar11 = lVar11 + 1;
          } while (lVar11 < *(int *)((long)plVar3 + 0x1c));
        }
        lVar11 = *plVar3;
        uVar2 = *(undefined4 *)(lVar11 + 0xd8);
        iVar9 = (int)plVar3[2];
        Vec_IntFillExtra((Vec_Int_t *)(lVar11 + 0xe0),iVar9 + 1,iVar8);
        if (((long)iVar9 < 0) || (*(int *)(lVar11 + 0xe4) <= iVar9)) {
LAB_00428715:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *(undefined4 *)(*(long *)(lVar11 + 0xe8) + (long)iVar9 * 4) = uVar2;
        in_RDX = extraout_RDX_04;
        if ((((*(int *)(*plVar3 + 4) != 4) || ((*(uint *)((long)plVar3 + 0x14) & 0xf) != 7)) ||
            (*(int *)((long)plVar3 + 0x1c) != 1)) || (plVar3[7] != 0)) {
          if (*(int *)((long)plVar3 + 0x2c) == 0) {
            local_40 = 0;
            printf("node %d has no fanout\n",(ulong)*(uint *)(plVar3 + 2));
            in_RDX = extraout_RDX_05;
          }
          bVar12 = local_40 == 0;
          local_40 = 1;
          if (bVar12) {
            local_40 = 0;
            break;
          }
        }
      }
      lVar10 = lVar10 + 1;
      pVVar7 = p->vObjs;
    } while (lVar10 < pVVar7->nSize);
  }
  if ((fVerbose != 0) && (local_40 != 0)) {
    puts("The network is in topo order and no dangling nodes.");
  }
  return local_40;
}

Assistant:

int Abc_SclCheckNtk( Abc_Ntk_t * p, int fVerbose )
{
    Abc_Obj_t * pObj, * pFanin;
    int i, k, fFlag = 1;
    Abc_NtkIncrementTravId( p );        
    Abc_NtkForEachCi( p, pObj, i )
        Abc_NodeSetTravIdCurrent( pObj );
    Abc_NtkForEachNode( p, pObj, i )
    {
        Abc_ObjForEachFanin( pObj, pFanin, k )
            if ( !Abc_NodeIsTravIdCurrent( pFanin ) )
                printf( "obj %d and its fanin %d are not in the topo order\n", Abc_ObjId(pObj), Abc_ObjId(pFanin) ), fFlag = 0;
        Abc_NodeSetTravIdCurrent( pObj );
        if ( Abc_ObjIsBarBuf(pObj) )
            continue;
        if ( Abc_ObjFanoutNum(pObj) == 0 )
            printf( "node %d has no fanout\n", Abc_ObjId(pObj) ), fFlag = 0;
        if ( !fFlag )
            break;
    }
    if ( fFlag && fVerbose )
        printf( "The network is in topo order and no dangling nodes.\n" );
    return fFlag;
}